

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiArea::~QMdiArea(QMdiArea *this)

{
  ~QMdiArea((QMdiArea *)&this[-1].super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x18);
  return;
}

Assistant:

QMdiArea::~QMdiArea()
{
    Q_D(QMdiArea);
    delete d->cascader;
    d->cascader = nullptr;

    delete d->regularTiler;
    d->regularTiler = nullptr;

    delete d->iconTiler;
    d->iconTiler = nullptr;

    delete d->placer;
    d->placer = nullptr;
}